

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O0

int CVodeSetMaxNumProjFails(void *cvode_mem,int max_fails)

{
  int in_ESI;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  int retval;
  CVodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = cvAccessProjMem((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                            (CVodeProjMem *)0x122e26);
  if (local_4 == 0) {
    if (in_ESI < 1) {
      *(undefined4 *)(in_stack_ffffffffffffffd8 + 4) = 10;
    }
    else {
      *(int *)(in_stack_ffffffffffffffd8 + 4) = in_ESI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetMaxNumProjFails(void* cvode_mem, int max_fails)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Set maximum number of projection failures in a step attempt */
  if (max_fails < 1)
  {
    /* Restore default */
    proj_mem->max_fails = PROJ_MAX_FAILS;
  }
  else
  {
    /* Update max number of fails */
    proj_mem->max_fails = max_fails;
  }

  return (CV_SUCCESS);
}